

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O0

void __thiscall V2Transport::MarkBytesSent(V2Transport *this,size_t bytes_sent)

{
  long lVar1;
  bool bVar2;
  Mutex *mutexIn;
  ulong uVar3;
  size_type sVar4;
  long in_RSI;
  UniqueLock<AnnotatedMixin<std::mutex>_> *in_RDI;
  long in_FS_OFFSET;
  ConstevalFormatString<1U> in_stack_00000008;
  undefined1 in_stack_00000010 [16];
  string_view in_stack_00000020;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock52;
  Level in_stack_00000100;
  long *in_stack_00000110;
  undefined4 in_stack_ffffffffffffff58;
  int in_stack_ffffffffffffff5c;
  char *in_stack_ffffffffffffff60;
  char *in_stack_ffffffffffffff68;
  int line;
  char *in_stack_ffffffffffffff70;
  V1Transport *in_stack_ffffffffffffff78;
  char *in_stack_ffffffffffffff80;
  undefined7 in_stack_ffffffffffffff88;
  undefined1 in_stack_ffffffffffffff8f;
  int local_50;
  undefined7 in_stack_ffffffffffffffc0;
  undefined1 in_stack_ffffffffffffffc7;
  int in_stack_ffffffffffffffcc;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  AssertLockNotHeldInline
            (in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c,
             (Mutex *)0x20c51f);
  line = (int)((ulong)in_stack_ffffffffffffff68 >> 0x20);
  mutexIn = MaybeCheckNotHeld((Mutex *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58)
                             );
  UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
            (in_RDI,mutexIn,(char *)CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88),
             in_stack_ffffffffffffff80,(int)((ulong)in_stack_ffffffffffffff78 >> 0x20),
             SUB81((ulong)in_stack_ffffffffffffff78 >> 0x18,0));
  if (*(char *)&in_RDI[0x5a].super_unique_lock._M_device == '\x03') {
    V1Transport::MarkBytesSent(in_stack_ffffffffffffff78,(size_t)in_stack_ffffffffffffff70);
  }
  else {
    if ((((*(char *)&in_RDI[0x5a].super_unique_lock._M_device == '\x01') &&
         (*(int *)&in_RDI[0x56].super_unique_lock._M_device == 0)) && (in_RSI != 0)) &&
       (bVar2 = ::LogAcceptCategory(CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
                                    Trace), bVar2)) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffff78,
                 in_stack_ffffffffffffff70);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffff78,
                 in_stack_ffffffffffffff70);
      line = (int)((ulong)(in_RDI + 0x2e) >> 0x20);
      in_stack_ffffffffffffff60 = "start sending v2 handshake to peer=%d\n";
      in_stack_ffffffffffffff58 = 1;
      LogPrintFormatInternal<long>
                (in_stack_00000020,(string_view)in_stack_00000010,in_stack_ffffffffffffffcc,
                 CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0),in_stack_00000100,
                 in_stack_00000008,in_stack_00000110);
    }
    local_50 = (int)in_RSI;
    *(int *)&in_RDI[0x56].super_unique_lock._M_device =
         *(int *)&in_RDI[0x56].super_unique_lock._M_device + local_50;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
    inline_assertion_check<false,bool>
              ((bool *)in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,line,
               in_stack_ffffffffffffff60,
               (char *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
    if (0x17 < *(uint *)&in_RDI[0x56].super_unique_lock._M_device) {
      *(undefined1 *)((long)&in_RDI[0x5a].super_unique_lock._M_device + 1) = 1;
    }
    uVar3 = (ulong)*(uint *)&in_RDI[0x56].super_unique_lock._M_device;
    sVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                       CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
    if (uVar3 == sVar4) {
      *(undefined4 *)&in_RDI[0x56].super_unique_lock._M_device = 0;
      ClearShrink<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                 CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
    }
  }
  UniqueLock<AnnotatedMixin<std::mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::mutex>_> *)
             CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void V2Transport::MarkBytesSent(size_t bytes_sent) noexcept
{
    AssertLockNotHeld(m_send_mutex);
    LOCK(m_send_mutex);
    if (m_send_state == SendState::V1) return m_v1_fallback.MarkBytesSent(bytes_sent);

    if (m_send_state == SendState::AWAITING_KEY && m_send_pos == 0 && bytes_sent > 0) {
        LogDebug(BCLog::NET, "start sending v2 handshake to peer=%d\n", m_nodeid);
    }

    m_send_pos += bytes_sent;
    Assume(m_send_pos <= m_send_buffer.size());
    if (m_send_pos >= CMessageHeader::HEADER_SIZE) {
        m_sent_v1_header_worth = true;
    }
    // Wipe the buffer when everything is sent.
    if (m_send_pos == m_send_buffer.size()) {
        m_send_pos = 0;
        ClearShrink(m_send_buffer);
    }
}